

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  byte bVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  char *buf_ptr;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_01;
  format_int local_48;
  
  pcVar3 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar6 = strlen(pcVar3);
  fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar3,pcVar3 + sVar6);
  sVar7 = (dest->super_buffer<char>).size_;
  uVar8 = sVar7 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar7] = ' ';
  pcVar3 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar6 = strlen(pcVar3);
  fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar3,pcVar3 + sVar6);
  sVar7 = (dest->super_buffer<char>).size_;
  uVar8 = sVar7 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar8) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar8;
  (dest->super_buffer<char>).ptr_[sVar7] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  local_48.str_ = fmt::v7::format_int::format_unsigned<unsigned_int>(&local_48,uVar4);
  if ((int)uVar1 < 0) {
    local_48.str_[-1] = '-';
    local_48.str_ = local_48.str_ + -1;
  }
  if (-0x16 < (long)&local_48 - (long)local_48.str_) {
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_48.str_,
               local_48.str_ + ((long)&local_48 - (long)local_48.str_) + 0x15);
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar7] = ' ';
    uVar1 = tm_time->tm_hour;
    if ((ulong)uVar1 < 100) {
      bVar5 = (byte)((uVar1 & 0xff) / 10);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = bVar5 | 0x30;
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = (char)uVar1 + bVar5 * -10 | 0x30;
    }
    else {
      format_str.size_ = 5;
      format_str.data_ = "{:02}";
      args.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_48;
      args.desc_ = 1;
      local_48.buffer_._0_8_ = (ulong)uVar1;
      fmt::v7::detail::vformat_to<char>(&dest->super_buffer<char>,format_str,args,(locale_ref)0x0);
    }
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar7] = ':';
    uVar1 = tm_time->tm_min;
    if ((ulong)uVar1 < 100) {
      bVar5 = (byte)((uVar1 & 0xff) / 10);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = bVar5 | 0x30;
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = (char)uVar1 + bVar5 * -10 | 0x30;
    }
    else {
      format_str_00.size_ = 5;
      format_str_00.data_ = "{:02}";
      args_00.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_48;
      args_00.desc_ = 1;
      local_48.buffer_._0_8_ = (ulong)uVar1;
      fmt::v7::detail::vformat_to<char>
                (&dest->super_buffer<char>,format_str_00,args_00,(locale_ref)0x0);
    }
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar7] = ':';
    uVar1 = tm_time->tm_sec;
    if ((ulong)uVar1 < 100) {
      bVar5 = (byte)((uVar1 & 0xff) / 10);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = bVar5 | 0x30;
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar8) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar7 = (dest->super_buffer<char>).size_;
        uVar8 = sVar7 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar8;
      (dest->super_buffer<char>).ptr_[sVar7] = (char)uVar1 + bVar5 * -10 | 0x30;
    }
    else {
      format_str_01.size_ = 5;
      format_str_01.data_ = "{:02}";
      args_01.field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_48;
      args_01.desc_ = 1;
      local_48.buffer_._0_8_ = (ulong)uVar1;
      fmt::v7::detail::vformat_to<char>
                (&dest->super_buffer<char>,format_str_01,args_01,(locale_ref)0x0);
    }
    sVar7 = (dest->super_buffer<char>).size_;
    uVar8 = sVar7 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar8) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar7 = (dest->super_buffer<char>).size_;
      uVar8 = sVar7 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar8;
    (dest->super_buffer<char>).ptr_[sVar7] = ' ';
    iVar2 = tm_time->tm_year;
    uVar1 = iVar2 + 0x76c;
    uVar4 = -uVar1;
    if (0 < (int)uVar1) {
      uVar4 = uVar1;
    }
    local_48.str_ = fmt::v7::format_int::format_unsigned<unsigned_int>(&local_48,uVar4);
    if (iVar2 < -0x76c) {
      local_48.str_[-1] = '-';
      local_48.str_ = local_48.str_ + -1;
    }
    if (-0x16 < (long)&local_48 - (long)local_48.str_) {
      fmt::v7::detail::buffer<char>::append<char>
                (&dest->super_buffer<char>,local_48.str_,
                 local_48.str_ + ((long)&local_48 - (long)local_48.str_) + 0x15);
      return;
    }
  }
  fmt::v7::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
             ,0x146,"negative value");
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }